

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O3

bool __thiscall crnlib::Resampler::put_line(Resampler *this,Sample *Psrc)

{
  int iVar1;
  Sample *Pdst;
  bool bVar2;
  void *pvVar3;
  long lVar4;
  
  iVar1 = this->m_cur_src_y;
  if (this->m_resample_src_y <= iVar1) {
    return false;
  }
  if (this->m_Psrc_y_count[iVar1] == 0) {
    this->m_cur_src_y = iVar1 + 1;
LAB_00150d44:
    bVar2 = true;
  }
  else {
    lVar4 = 0;
    do {
      if (*(int *)((long)this->m_Pscan_buf->scan_buf_y + lVar4) == -1) {
        this->m_Psrc_y_flag[iVar1] = '\x01';
        *(int *)((long)this->m_Pscan_buf->scan_buf_y + lVar4) = this->m_cur_src_y;
        if (*(long *)((long)this->m_Pscan_buf->scan_buf_l + lVar4 * 2) == 0) {
          pvVar3 = crnlib_malloc((long)this->m_intermediate_x << 2);
          *(void **)((long)this->m_Pscan_buf->scan_buf_l + lVar4 * 2) = pvVar3;
          if (pvVar3 == (void *)0x0) {
            this->m_status = STATUS_OUT_OF_MEMORY;
            goto LAB_00150cbe;
          }
        }
        Pdst = *(Sample **)((long)this->m_Pscan_buf->scan_buf_l + lVar4 * 2);
        if (this->m_delay_x_resample == true) {
          memcpy(Pdst,Psrc,(long)this->m_intermediate_x << 2);
        }
        else {
          resample_x(this,Pdst,Psrc);
        }
        this->m_cur_src_y = this->m_cur_src_y + 1;
        goto LAB_00150d44;
      }
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x10000);
    this->m_status = STATUS_SCAN_BUFFER_FULL;
LAB_00150cbe:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Resampler::put_line(const Sample* Psrc) {
  int i;

  if (m_cur_src_y >= m_resample_src_y)
    return false;

  /* Does this source line contribute
      * to any destination line? if not,
      * exit now.
      */

  if (!m_Psrc_y_count[resampler_range_check(m_cur_src_y, m_resample_src_y)]) {
    m_cur_src_y++;
    return true;
  }

  /* Find an empty slot in the scanline buffer. (FIXME: Perf. is terrible here with extreme scaling ratios.) */

  for (i = 0; i < MAX_SCAN_BUF_SIZE; i++)
    if (m_Pscan_buf->scan_buf_y[i] == -1)
      break;

  /* If the buffer is full, exit with an error. */

  if (i == MAX_SCAN_BUF_SIZE) {
    m_status = STATUS_SCAN_BUFFER_FULL;
    return false;
  }

  m_Psrc_y_flag[resampler_range_check(m_cur_src_y, m_resample_src_y)] = TRUE;
  m_Pscan_buf->scan_buf_y[i] = m_cur_src_y;

  /* Does this slot have any memory allocated to it? */

  if (!m_Pscan_buf->scan_buf_l[i]) {
    if ((m_Pscan_buf->scan_buf_l[i] = (Sample*)crnlib_malloc(m_intermediate_x * sizeof(Sample))) == NULL) {
      m_status = STATUS_OUT_OF_MEMORY;
      return false;
    }
  }

  // Resampling on the X axis first?
  if (m_delay_x_resample) {
    resampler_assert(m_intermediate_x == m_resample_src_x);

    // Y-X resampling order
    memcpy(m_Pscan_buf->scan_buf_l[i], Psrc, m_intermediate_x * sizeof(Sample));
  } else {
    resampler_assert(m_intermediate_x == m_resample_dst_x);

    // X-Y resampling order
    resample_x(m_Pscan_buf->scan_buf_l[i], Psrc);
  }

  m_cur_src_y++;

  return true;
}